

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O0

BoolExpr * BO_gr_or_equal(List *ls)

{
  List *ls_local;
  
  if (((ls->cdr == (ListStruct *)0x0) || (ls->cdr->cdr == (ListStruct *)0x0)) ||
     (ls->cdr->cdr->cdr != (ListStruct *)0x0)) {
    parse_error(ls,">= takes two arguments.\n");
    ls_local = (List *)&false_bool_expr;
  }
  else if (((ls->cdr->token).type == TOK_NUMBER) && ((ls->cdr->cdr->token).type == TOK_NUMBER)) {
    ls_local = (List *)&false_bool_expr;
    if ((ls->cdr->cdr->token).u.n <= (ls->cdr->token).u.n) {
      ls_local = (List *)&true_bool_expr;
    }
  }
  else {
    parse_error(ls,">= can only be used to compare numerical quantities!\n");
    ls_local = (List *)&false_bool_expr;
  }
  return (BoolExpr *)ls_local;
}

Assistant:

static BoolExpr *
BO_gr_or_equal (const List *ls)
{
  if (ls->cdr == NULL || ls->cdr->cdr == NULL || CDDDR (ls) != NULL)
    {
      parse_error (ls, ">= takes two arguments.\n");
      return &false_bool_expr;  /* default = FALSE */
    }
  if (ls->cdr->token.type != TOK_NUMBER || CDDR (ls)->token.type != TOK_NUMBER)
    {
      parse_error (ls,
		   ">= can only be used to compare numerical quantities!\n");
      return &false_bool_expr;  /* default = FALSE */
    }

  return (ls->cdr->token.u.n >= CDDR (ls)->token.u.n)
    ? &true_bool_expr : &false_bool_expr;
}